

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

const_iterator __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::end
          (RepeatedField<google::protobuf::UnknownField> *this)

{
  bool is_soo_00;
  int iVar1;
  UnknownField *pUVar2;
  bool is_soo;
  RepeatedField<google::protobuf::UnknownField> *this_local;
  
  is_soo_00 = RepeatedField<google::protobuf::UnknownField>::is_soo(this);
  pUVar2 = unsafe_elements(this,is_soo_00);
  iVar1 = size(this,is_soo_00);
  internal::RepeatedIterator<const_google::protobuf::UnknownField>::RepeatedIterator
            ((RepeatedIterator<const_google::protobuf::UnknownField> *)&this_local,pUVar2 + iVar1);
  return (const_iterator)(pointer)this_local;
}

Assistant:

inline typename RepeatedField<Element>::const_iterator
RepeatedField<Element>::end() const ABSL_ATTRIBUTE_LIFETIME_BOUND {
  const bool is_soo = this->is_soo();
  return const_iterator(unsafe_elements(is_soo) + size(is_soo));
}